

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter_sse2.c
# Opt level: O2

void av1_apply_temporal_filter_sse2
               (YV12_BUFFER_CONFIG *frame_to_filter,MACROBLOCKD *mbd,BLOCK_SIZE block_size,
               int mb_row,int mb_col,int num_planes,double *noise_levels,MV *subblock_mvs,
               int *subblock_mses,int q_factor,int filter_strength,int tf_wgt_calc_lvl,uint8_t *pred
               ,uint32_t *accum,uint16_t *count)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  undefined1 auVar18 [14];
  undefined1 auVar19 [14];
  undefined1 auVar20 [15];
  undefined1 auVar21 [14];
  undefined1 auVar22 [14];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [14];
  undefined1 auVar26 [14];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  ushort uVar30;
  byte bVar31;
  byte bVar32;
  byte bVar33;
  byte bVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  byte bVar39;
  byte bVar40;
  byte bVar41;
  byte bVar42;
  byte bVar43;
  byte bVar44;
  byte bVar45;
  byte bVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined1 auVar50 [15];
  unkuint9 Var51;
  undefined1 auVar52 [11];
  undefined1 auVar53 [13];
  undefined1 auVar54 [14];
  undefined1 auVar55 [14];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  byte bVar58;
  byte bVar59;
  uint uVar60;
  uint uVar61;
  byte bVar64;
  byte bVar65;
  uint uVar66;
  uint32_t *puVar67;
  undefined7 in_register_00000011;
  uint16_t *puVar68;
  uint8_t *src1;
  uint8_t *puVar69;
  ulong uVar70;
  uint8_t *puVar71;
  ulong uVar72;
  undefined1 (*pauVar73) [16];
  ulong uVar74;
  ulong uVar75;
  long lVar76;
  uint32_t *puVar77;
  int row;
  int iVar78;
  uint uVar79;
  int iVar80;
  int subblock_idx;
  long lVar81;
  ulong uVar82;
  uint8_t *puVar83;
  bool bVar84;
  ulong uVar85;
  double dVar87;
  short sVar91;
  undefined1 auVar88 [14];
  double dVar86;
  __m128i vsum2;
  undefined1 auVar90 [16];
  double dVar93;
  double dVar94;
  double dVar95;
  undefined1 auVar96 [16];
  double dVar97;
  uint uVar98;
  double dVar99;
  uint uVar101;
  __m128i vsum1;
  undefined1 auVar100 [16];
  undefined1 auVar102 [14];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  double dVar105;
  undefined1 auVar106 [16];
  int local_2b0c;
  uint32_t (*local_2af0) [32];
  double local_2ab8;
  uint32_t *local_2a80;
  double d_factor [4];
  undefined1 local_2a18 [16];
  undefined8 local_2a08;
  undefined8 uStack_2a00;
  undefined1 local_29f8 [16];
  undefined8 local_29e8 [2];
  undefined1 local_29d8 [16];
  undefined8 local_29c8;
  undefined8 uStack_29c0;
  undefined1 local_29b8 [16];
  undefined1 local_29a8 [16];
  undefined1 local_2998 [16];
  undefined1 local_2988 [16];
  double adStack_2978 [4];
  double subblock_mses_scaled [4];
  uint16_t frame_sse [1152];
  uint32_t luma_sse_sum [1024];
  uint32_t acc_5x5_sse [32] [32];
  ulong uVar62;
  ulong uVar63;
  undefined1 auVar89 [16];
  undefined2 uVar92;
  
  uVar72 = CONCAT71(in_register_00000011,block_size) & 0xffffffff;
  bVar2 = block_size_high[uVar72];
  bVar3 = block_size_wide[uVar72];
  iVar78 = (frame_to_filter->field_2).field_0.y_crop_width;
  iVar80 = (frame_to_filter->field_3).field_0.y_crop_height;
  if (iVar80 < iVar78) {
    iVar78 = iVar80;
  }
  dVar105 = (double)q_factor / 20.0;
  dVar105 = dVar105 * dVar105;
  dVar95 = 1.0;
  if (dVar105 <= 1.0) {
    dVar95 = dVar105;
  }
  dVar99 = (double)q_factor * 0.015625;
  dVar86 = (double)filter_strength * 0.25 * (double)filter_strength * 0.25;
  dVar93 = 1.0;
  if (dVar86 <= 1.0) {
    dVar93 = dVar86;
  }
  d_factor[2] = 0.0;
  d_factor[3] = 0.0;
  d_factor[0] = 0.0;
  d_factor[1] = 0.0;
  lVar81 = 0;
  memset(frame_sse,0,0x900);
  memset(luma_sse_sum,0,0x1000);
  dVar87 = (double)iVar78 * 0.1;
  if (dVar87 <= 1.0) {
    dVar87 = 1.0;
  }
  for (; lVar81 != 4; lVar81 = lVar81 + 1) {
    auVar96 = pshuflw(ZEXT416((uint)subblock_mvs[lVar81]),ZEXT416((uint)subblock_mvs[lVar81]),0x60);
    dVar94 = (double)(auVar96._0_4_ >> 0x10);
    dVar97 = (double)(auVar96._4_4_ >> 0x10);
    dVar94 = SQRT(dVar97 * dVar97 + dVar94 * dVar94) / dVar87;
    if (dVar94 <= 1.0) {
      dVar94 = 1.0;
    }
    d_factor[lVar81] = dVar94;
  }
  local_2ab8 = dVar99 * dVar99 * 0.5;
  if (q_factor < 0x80) {
    local_2ab8 = (double)(-(ulong)(dVar105 < 1e-05) & 0x3ee4f8b588e368f1 |
                         ~-(ulong)(dVar105 < 1e-05) & (ulong)dVar95);
  }
  if (num_planes < 1) {
    num_planes = 0;
  }
  local_2b0c = 0;
  for (uVar72 = 0; uVar72 != (uint)num_planes; uVar72 = uVar72 + 1) {
    bVar64 = (byte)mbd->plane[uVar72].subsampling_y;
    bVar58 = bVar2 >> (bVar64 & 0x1f);
    uVar60 = (uint)bVar58;
    uVar62 = (ulong)uVar60;
    bVar65 = (byte)mbd->plane[uVar72].subsampling_x;
    bVar59 = bVar3 >> (bVar65 & 0x1f);
    uVar61 = (uint)bVar59;
    uVar63 = (ulong)uVar61;
    bVar65 = bVar65 - (char)mbd->plane[0].subsampling_x;
    bVar64 = bVar64 - (char)mbd->plane[0].subsampling_y;
    dVar95 = 0.04;
    if (uVar72 != 0) {
      dVar95 = 1.0 / (double)((1 << (bVar64 + bVar65 & 0x1f)) + 0x19);
    }
    uVar98 = *(uint *)((long)frame_to_filter->store_buf_adr + (ulong)(uVar72 != 0) * 4 + -0x28);
    puVar69 = frame_to_filter->store_buf_adr[uVar72 - 4] +
              (int)(uVar61 * mb_col + uVar98 * uVar60 * mb_row);
    dVar105 = log(noise_levels[uVar72] + noise_levels[uVar72] + 5.0);
    if (uVar72 == 1) {
      uVar66 = 1 << (bVar65 & 0x1f);
      if (1 << (bVar65 & 0x1f) < 1) {
        uVar66 = 0;
      }
      uVar101 = 1 << (bVar64 & 0x1f);
      if (1 << (bVar64 & 0x1f) < 1) {
        uVar101 = 0;
      }
      for (uVar70 = 0; uVar70 != uVar62; uVar70 = uVar70 + 1) {
        for (uVar75 = 0; uVar75 != uVar63; uVar75 = uVar75 + 1) {
          iVar78 = ((int)uVar75 << (bVar65 & 0x1f)) + (((int)uVar70 << (bVar64 & 0x1f)) * 0x24 | 2U)
          ;
          for (uVar79 = 0; uVar82 = (ulong)uVar66, iVar80 = iVar78, uVar79 != uVar101;
              uVar79 = uVar79 + 1) {
            while (bVar84 = uVar82 != 0, uVar82 = uVar82 - 1, bVar84) {
              luma_sse_sum[uVar75 + uVar70 * 0x20] =
                   luma_sse_sum[uVar75 + uVar70 * 0x20] + (uint)frame_sse[iVar80];
              iVar80 = iVar80 + 1;
            }
            iVar78 = iVar78 + 0x24;
          }
        }
      }
    }
    lVar81 = (long)local_2b0c;
    puVar83 = pred + lVar81;
    puVar68 = frame_sse;
    puVar71 = puVar83;
    for (uVar66 = 0; uVar66 != uVar60; uVar66 = uVar66 + 1) {
      for (uVar70 = 0; uVar70 < uVar63; uVar70 = uVar70 + 0x10) {
        puVar68[0] = 0;
        puVar68[1] = 0;
        pbVar1 = puVar69 + uVar70;
        bVar31 = *pbVar1;
        bVar32 = pbVar1[1];
        bVar33 = pbVar1[2];
        bVar34 = pbVar1[3];
        bVar35 = pbVar1[4];
        bVar36 = pbVar1[5];
        bVar37 = pbVar1[6];
        bVar38 = pbVar1[7];
        bVar39 = pbVar1[8];
        bVar40 = pbVar1[9];
        bVar41 = pbVar1[10];
        bVar42 = pbVar1[0xb];
        bVar43 = pbVar1[0xc];
        bVar44 = pbVar1[0xd];
        bVar45 = pbVar1[0xe];
        bVar46 = pbVar1[0xf];
        auVar96 = *(undefined1 (*) [16])(puVar71 + uVar70);
        bVar64 = auVar96[0];
        auVar103[0] = (bVar31 < bVar64) * bVar64 | (bVar31 >= bVar64) * bVar31;
        bVar65 = auVar96[1];
        auVar103[1] = (bVar32 < bVar65) * bVar65 | (bVar32 >= bVar65) * bVar32;
        bVar4 = auVar96[2];
        auVar103[2] = (bVar33 < bVar4) * bVar4 | (bVar33 >= bVar4) * bVar33;
        bVar5 = auVar96[3];
        auVar103[3] = (bVar34 < bVar5) * bVar5 | (bVar34 >= bVar5) * bVar34;
        bVar6 = auVar96[4];
        auVar103[4] = (bVar35 < bVar6) * bVar6 | (bVar35 >= bVar6) * bVar35;
        bVar7 = auVar96[5];
        auVar103[5] = (bVar36 < bVar7) * bVar7 | (bVar36 >= bVar7) * bVar36;
        bVar8 = auVar96[6];
        auVar103[6] = (bVar37 < bVar8) * bVar8 | (bVar37 >= bVar8) * bVar37;
        bVar9 = auVar96[7];
        auVar103[7] = (bVar38 < bVar9) * bVar9 | (bVar38 >= bVar9) * bVar38;
        bVar10 = auVar96[8];
        auVar103[8] = (bVar39 < bVar10) * bVar10 | (bVar39 >= bVar10) * bVar39;
        bVar11 = auVar96[9];
        auVar103[9] = (bVar40 < bVar11) * bVar11 | (bVar40 >= bVar11) * bVar40;
        bVar12 = auVar96[10];
        auVar103[10] = (bVar41 < bVar12) * bVar12 | (bVar41 >= bVar12) * bVar41;
        bVar13 = auVar96[0xb];
        auVar103[0xb] = (bVar42 < bVar13) * bVar13 | (bVar42 >= bVar13) * bVar42;
        bVar14 = auVar96[0xc];
        auVar103[0xc] = (bVar43 < bVar14) * bVar14 | (bVar43 >= bVar14) * bVar43;
        bVar15 = auVar96[0xd];
        auVar103[0xd] = (bVar44 < bVar15) * bVar15 | (bVar44 >= bVar15) * bVar44;
        bVar16 = auVar96[0xe];
        auVar103[0xe] = (bVar45 < bVar16) * bVar16 | (bVar45 >= bVar16) * bVar45;
        bVar17 = auVar96[0xf];
        auVar103[0xf] = (bVar46 < bVar17) * bVar17 | (bVar46 >= bVar17) * bVar46;
        auVar96[0] = (bVar64 < bVar31) * bVar64 | (bVar64 >= bVar31) * bVar31;
        auVar96[1] = (bVar65 < bVar32) * bVar65 | (bVar65 >= bVar32) * bVar32;
        auVar96[2] = (bVar4 < bVar33) * bVar4 | (bVar4 >= bVar33) * bVar33;
        auVar96[3] = (bVar5 < bVar34) * bVar5 | (bVar5 >= bVar34) * bVar34;
        auVar96[4] = (bVar6 < bVar35) * bVar6 | (bVar6 >= bVar35) * bVar35;
        auVar96[5] = (bVar7 < bVar36) * bVar7 | (bVar7 >= bVar36) * bVar36;
        auVar96[6] = (bVar8 < bVar37) * bVar8 | (bVar8 >= bVar37) * bVar37;
        auVar96[7] = (bVar9 < bVar38) * bVar9 | (bVar9 >= bVar38) * bVar38;
        auVar96[8] = (bVar10 < bVar39) * bVar10 | (bVar10 >= bVar39) * bVar39;
        auVar96[9] = (bVar11 < bVar40) * bVar11 | (bVar11 >= bVar40) * bVar40;
        auVar96[10] = (bVar12 < bVar41) * bVar12 | (bVar12 >= bVar41) * bVar41;
        auVar96[0xb] = (bVar13 < bVar42) * bVar13 | (bVar13 >= bVar42) * bVar42;
        auVar96[0xc] = (bVar14 < bVar43) * bVar14 | (bVar14 >= bVar43) * bVar43;
        auVar96[0xd] = (bVar15 < bVar44) * bVar15 | (bVar15 >= bVar44) * bVar44;
        auVar96[0xe] = (bVar16 < bVar45) * bVar16 | (bVar16 >= bVar45) * bVar45;
        auVar96[0xf] = (bVar17 < bVar46) * bVar17 | (bVar17 >= bVar46) * bVar46;
        auVar96 = psubusb(auVar103,auVar96);
        auVar20[0xd] = 0;
        auVar20._0_13_ = auVar96._0_13_;
        auVar20[0xe] = auVar96[7];
        auVar23[0xc] = auVar96[6];
        auVar23._0_12_ = auVar96._0_12_;
        auVar23._13_2_ = auVar20._13_2_;
        auVar24[0xb] = 0;
        auVar24._0_11_ = auVar96._0_11_;
        auVar24._12_3_ = auVar23._12_3_;
        auVar27[10] = auVar96[5];
        auVar27._0_10_ = auVar96._0_10_;
        auVar27._11_4_ = auVar24._11_4_;
        auVar28[9] = 0;
        auVar28._0_9_ = auVar96._0_9_;
        auVar28._10_5_ = auVar27._10_5_;
        auVar29[8] = auVar96[4];
        auVar29._0_8_ = auVar96._0_8_;
        auVar29._9_6_ = auVar28._9_6_;
        auVar50._7_8_ = 0;
        auVar50._0_7_ = auVar29._8_7_;
        Var51 = CONCAT81(SUB158(auVar50 << 0x40,7),auVar96[3]);
        auVar56._9_6_ = 0;
        auVar56._0_9_ = Var51;
        auVar52._1_10_ = SUB1510(auVar56 << 0x30,5);
        auVar52[0] = auVar96[2];
        auVar57._11_4_ = 0;
        auVar57._0_11_ = auVar52;
        auVar53._1_12_ = SUB1512(auVar57 << 0x20,3);
        auVar53[0] = auVar96[1];
        auVar106._0_2_ = (ushort)auVar96[0] * (ushort)auVar96[0];
        auVar106._2_2_ = auVar53._0_2_ * auVar53._0_2_;
        auVar106._4_2_ = auVar52._0_2_ * auVar52._0_2_;
        sVar91 = (short)Var51;
        auVar106._6_2_ = sVar91 * sVar91;
        auVar106._8_2_ = auVar29._8_2_ * auVar29._8_2_;
        auVar106._10_2_ = auVar27._10_2_ * auVar27._10_2_;
        uVar30 = auVar20._13_2_ >> 8;
        auVar106._12_2_ = auVar23._12_2_ * auVar23._12_2_;
        auVar106._14_2_ = uVar30 * uVar30;
        auVar104._0_2_ = (ushort)auVar96[8] * (ushort)auVar96[8];
        auVar104._2_2_ = (ushort)auVar96[9] * (ushort)auVar96[9];
        auVar104._4_2_ = (ushort)auVar96[10] * (ushort)auVar96[10];
        auVar104._6_2_ = (ushort)auVar96[0xb] * (ushort)auVar96[0xb];
        auVar104._8_2_ = (ushort)auVar96[0xc] * (ushort)auVar96[0xc];
        auVar104._10_2_ = (ushort)auVar96[0xd] * (ushort)auVar96[0xd];
        auVar104._12_2_ = (ushort)auVar96[0xe] * (ushort)auVar96[0xe];
        auVar104._14_2_ = (ushort)auVar96[0xf] * (ushort)auVar96[0xf];
        *(undefined1 (*) [16])(puVar68 + uVar70 + 2) = auVar106;
        *(undefined1 (*) [16])(puVar68 + uVar70 + 10) = auVar104;
      }
      (puVar68 + uVar63 + 2)[0] = 0;
      (puVar68 + uVar63 + 2)[1] = 0;
      puVar69 = puVar69 + uVar98;
      puVar71 = puVar71 + uVar63;
      puVar68 = puVar68 + 0x24;
    }
    puVar67 = acc_5x5_sse[0];
    for (uVar70 = 0; uVar70 < uVar63; uVar70 = uVar70 + 4) {
      pauVar73 = (undefined1 (*) [16])(frame_sse + uVar70);
      for (lVar76 = 0x50; lVar76 != 0xb0; lVar76 = lVar76 + 0x20) {
        auVar96 = *pauVar73;
        auVar18._10_2_ = 0;
        auVar18._0_10_ = auVar96._0_10_;
        auVar18._12_2_ = auVar96._6_2_;
        auVar21._8_2_ = auVar96._4_2_;
        auVar21._0_8_ = auVar96._0_8_;
        auVar21._10_4_ = auVar18._10_4_;
        auVar54._6_8_ = 0;
        auVar54._0_6_ = auVar21._8_6_;
        auVar25._4_2_ = auVar96._2_2_;
        auVar25._0_4_ = auVar96._0_4_;
        auVar25._6_8_ = SUB148(auVar54 << 0x40,6);
        auVar100._0_4_ = auVar96._0_4_ & 0xffff;
        auVar100._4_10_ = auVar25._4_10_;
        auVar100._14_2_ = 0;
        if (uVar70 == 0) {
          auVar100._8_4_ = auVar21._8_4_;
          auVar100._4_4_ = auVar100._8_4_;
          auVar100._0_4_ = auVar100._8_4_;
          auVar100._12_4_ = auVar18._10_4_ >> 0x10;
        }
        auVar88._0_4_ = CONCAT22(0,auVar96._8_2_);
        uVar92 = auVar96._10_2_;
        auVar88._4_2_ = uVar92;
        auVar88._6_2_ = 0;
        auVar88._8_2_ = auVar96._12_2_;
        auVar88._10_2_ = 0;
        auVar88._12_2_ = auVar96._14_2_;
        *(undefined1 (*) [16])((long)d_factor + lVar76 + 0x10) = auVar100;
        if ((long)(int)(uVar61 - 4) <= (long)uVar70) {
          auVar88._6_2_ = 0;
          auVar88._8_2_ = uVar92;
          auVar88._10_2_ = 0;
          auVar88._12_2_ = uVar92;
        }
        auVar89._14_2_ = 0;
        auVar89._0_14_ = auVar88;
        *(undefined1 (*) [16])(local_2a18 + lVar76) = auVar89;
        pauVar73 = (undefined1 (*) [16])(pauVar73[4] + 8);
      }
      local_2a18 = local_29d8;
      local_2a08 = local_29c8;
      uStack_2a00 = uStack_29c0;
      local_29f8 = local_29d8;
      local_29e8[0] = local_29c8;
      local_29e8[1] = uStack_29c0;
      puVar77 = puVar67;
      for (uVar75 = 0; uVar75 != uVar62; uVar75 = uVar75 + 1) {
        uVar98 = 0;
        uVar66 = 0;
        uVar101 = 0;
        uVar79 = 0;
        auVar96 = (undefined1  [16])0x0;
        for (lVar76 = 0x10; lVar76 != 0xb0; lVar76 = lVar76 + 0x20) {
          uVar98 = uVar98 + *(int *)((long)d_factor + lVar76 + 0x10);
          uVar66 = uVar66 + *(int *)((long)d_factor + lVar76 + 0x14);
          uVar101 = uVar101 + *(int *)((long)d_factor + lVar76 + 0x18);
          uVar79 = uVar79 + *(int *)((long)d_factor + lVar76 + 0x1c);
          auVar90._0_4_ = auVar96._0_4_ + *(int *)(local_2a18 + lVar76);
          auVar90._4_4_ = auVar96._4_4_ + *(int *)(local_2a18 + lVar76 + 4);
          auVar90._8_4_ = auVar96._8_4_ + *(int *)(local_2a18 + lVar76 + 8);
          auVar90._12_4_ = auVar96._12_4_ + *(int *)(local_2a18 + lVar76 + 0xc);
          auVar96 = auVar90;
        }
        for (lVar76 = 0; lVar76 != 0x80; lVar76 = lVar76 + 0x20) {
          uVar47 = *(undefined8 *)(local_29f8 + lVar76 + 8);
          uVar48 = *(undefined8 *)((long)local_29e8 + lVar76);
          uVar49 = *(undefined8 *)(local_29d8 + lVar76 + -8);
          *(undefined8 *)(local_2a18 + lVar76) = *(undefined8 *)(local_29f8 + lVar76);
          *(undefined8 *)(local_2a18 + lVar76 + 8) = uVar47;
          *(undefined8 *)((long)&local_2a08 + lVar76) = uVar48;
          *(undefined8 *)(local_29f8 + lVar76 + -8) = uVar49;
        }
        local_2988 = local_29a8;
        local_2998 = local_29b8;
        if ((long)uVar75 <= (long)(int)(uVar60 - 4)) {
          auVar106 = *pauVar73;
          auVar19._10_2_ = 0;
          auVar19._0_10_ = auVar106._0_10_;
          auVar19._12_2_ = auVar106._6_2_;
          auVar22._8_2_ = auVar106._4_2_;
          auVar22._0_8_ = auVar106._0_8_;
          auVar22._10_4_ = auVar19._10_4_;
          auVar55._6_8_ = 0;
          auVar55._0_6_ = auVar22._8_6_;
          auVar26._4_2_ = auVar106._2_2_;
          auVar26._0_4_ = auVar106._0_4_;
          auVar26._6_8_ = SUB148(auVar55 << 0x40,6);
          local_2998._0_4_ = auVar106._0_4_ & 0xffff;
          local_2998._4_10_ = auVar26._4_10_;
          local_2998._14_2_ = 0;
          if (uVar70 == 0) {
            local_2998._8_4_ = auVar22._8_4_;
            local_2998._4_4_ = local_2998._8_4_;
            local_2998._0_4_ = local_2998._8_4_;
            local_2998._12_4_ = auVar19._10_4_ >> 0x10;
          }
          auVar102._0_4_ = CONCAT22(0,auVar106._8_2_);
          uVar92 = auVar106._10_2_;
          auVar102._4_2_ = uVar92;
          auVar102._6_2_ = 0;
          auVar102._8_2_ = auVar106._12_2_;
          auVar102._10_2_ = 0;
          auVar102._12_2_ = auVar106._14_2_;
          if ((long)(int)(uVar61 - 4) <= (long)uVar70) {
            auVar102._6_2_ = 0;
            auVar102._8_2_ = uVar92;
            auVar102._10_2_ = 0;
            auVar102._12_2_ = uVar92;
          }
          local_2988._14_2_ = 0;
          local_2988._0_14_ = auVar102;
          pauVar73 = (undefined1 (*) [16])(pauVar73[4] + 8);
        }
        for (lVar76 = 0; lVar76 != 0x10; lVar76 = lVar76 + 4) {
          auVar106 = *(undefined1 (*) [16])(sse_bytemask_2x4[0][1] + lVar76 * 2) & auVar96;
          *(uint32_t *)((long)puVar77 + lVar76) =
               auVar106._12_4_ + (sse_bytemask_2x4[0][0][lVar76 * 2 + 3] & uVar79) +
               auVar106._4_4_ + (sse_bytemask_2x4[0][0][lVar76 * 2 + 1] & uVar66) +
               auVar106._8_4_ + (sse_bytemask_2x4[0][0][lVar76 * 2 + 2] & uVar101) +
               auVar106._0_4_ + (sse_bytemask_2x4[0][0][lVar76 * 2] & uVar98);
        }
        puVar77 = puVar77 + 0x20;
      }
      puVar67 = puVar67 + 4;
    }
    for (lVar76 = 0; lVar76 != 4; lVar76 = lVar76 + 1) {
      subblock_mses_scaled[lVar76] = (double)subblock_mses[lVar76] * 0.008333333333333333;
      adStack_2978[lVar76] =
           d_factor[lVar76] *
           (1.0 / ((dVar105 + 0.5) * local_2ab8 *
                  (double)(~-(ulong)(dVar86 < 1e-05) & (ulong)dVar93 |
                          -(ulong)(dVar86 < 1e-05) & 0x3ee4f8b588e368f1)));
    }
    uVar70 = (ulong)(bVar58 >> 1);
    uVar75 = (ulong)(bVar59 >> 1);
    local_2af0 = acc_5x5_sse;
    if (tf_wgt_calc_lvl == 0) {
      local_2a80 = luma_sse_sum;
      lVar76 = 0;
      for (uVar82 = 0; uVar82 != uVar62; uVar82 = uVar82 + 1) {
        lVar76 = (long)(int)lVar76;
        for (uVar74 = 0; uVar63 != uVar74; uVar74 = uVar74 + 1) {
          bVar64 = puVar83[uVar74];
          uVar85 = (ulong)(((uint)(uVar75 <= uVar74) | (uint)(uVar70 <= uVar82) * 2) << 3);
          dVar105 = ((double)(local_2a80[uVar74] + (*local_2af0)[uVar74]) * dVar95 *
                     0.041666666666666664 + *(double *)((long)subblock_mses_scaled + uVar85)) *
                    *(double *)((long)adStack_2978 + uVar85);
          uVar85 = -(ulong)(dVar105 < 7.0);
          dVar105 = exp((double)(~uVar85 & 0xc01c000000000000 | (ulong)-dVar105 & uVar85));
          count[lVar81 + lVar76 + uVar74] =
               count[lVar81 + lVar76 + uVar74] + (short)(int)(dVar105 * 1000.0);
          accum[lVar81 + lVar76 + uVar74] =
               accum[lVar81 + lVar76 + uVar74] + (uint)bVar64 * (int)(dVar105 * 1000.0);
        }
        lVar76 = lVar76 + uVar74;
        local_2a80 = local_2a80 + 0x20;
        local_2af0 = local_2af0 + 1;
        puVar83 = puVar83 + uVar63;
      }
    }
    else {
      puVar67 = luma_sse_sum;
      lVar76 = 0;
      for (uVar82 = 0; uVar82 != uVar62; uVar82 = uVar82 + 1) {
        lVar76 = (long)(int)lVar76;
        for (uVar74 = 0; uVar63 != uVar74; uVar74 = uVar74 + 1) {
          bVar64 = puVar83[uVar74];
          uVar85 = (ulong)(((uint)(uVar75 <= uVar74) | (uint)(uVar70 <= uVar82) * 2) << 3);
          dVar105 = ((double)(puVar67[uVar74] + (*local_2af0)[uVar74]) * dVar95 *
                     0.041666666666666664 + *(double *)((long)subblock_mses_scaled + uVar85)) *
                    *(double *)((long)adStack_2978 + uVar85);
          if (7.0 <= dVar105) {
            dVar105 = 7.0;
          }
          iVar78 = (int)((float)((int)((float)dVar105 * -12102203.0) + 0x3f7f127f) * 1000.0 + 0.5);
          count[lVar81 + lVar76 + uVar74] = count[lVar81 + lVar76 + uVar74] + (short)iVar78;
          accum[lVar81 + lVar76 + uVar74] = accum[lVar81 + lVar76 + uVar74] + (uint)bVar64 * iVar78;
        }
        puVar67 = puVar67 + 0x20;
        local_2af0 = local_2af0 + 1;
        puVar83 = puVar83 + uVar63;
        lVar76 = lVar76 + uVar74;
      }
    }
    local_2b0c = local_2b0c + uVar61 * uVar60;
  }
  return;
}

Assistant:

void av1_apply_temporal_filter_sse2(
    const YV12_BUFFER_CONFIG *frame_to_filter, const MACROBLOCKD *mbd,
    const BLOCK_SIZE block_size, const int mb_row, const int mb_col,
    const int num_planes, const double *noise_levels, const MV *subblock_mvs,
    const int *subblock_mses, const int q_factor, const int filter_strength,
    int tf_wgt_calc_lvl, const uint8_t *pred, uint32_t *accum,
    uint16_t *count) {
  const int is_high_bitdepth = frame_to_filter->flags & YV12_FLAG_HIGHBITDEPTH;
  assert(block_size == BLOCK_32X32 && "Only support 32x32 block with sse2!");
  assert(TF_WINDOW_LENGTH == 5 && "Only support window length 5 with sse2!");
  assert(!is_high_bitdepth && "Only support low bit-depth with sse2!");
  assert(num_planes >= 1 && num_planes <= MAX_MB_PLANE);
  (void)is_high_bitdepth;

  const int mb_height = block_size_high[block_size];
  const int mb_width = block_size_wide[block_size];
  const int frame_height = frame_to_filter->y_crop_height;
  const int frame_width = frame_to_filter->y_crop_width;
  const int min_frame_size = AOMMIN(frame_height, frame_width);
  // Variables to simplify combined error calculation.
  const double inv_factor = 1.0 / ((TF_WINDOW_BLOCK_BALANCE_WEIGHT + 1) *
                                   TF_SEARCH_ERROR_NORM_WEIGHT);
  const double weight_factor =
      (double)TF_WINDOW_BLOCK_BALANCE_WEIGHT * inv_factor;
  // Adjust filtering based on q.
  // Larger q -> stronger filtering -> larger weight.
  // Smaller q -> weaker filtering -> smaller weight.
  double q_decay = pow((double)q_factor / TF_Q_DECAY_THRESHOLD, 2);
  q_decay = CLIP(q_decay, 1e-5, 1);
  if (q_factor >= TF_QINDEX_CUTOFF) {
    // Max q_factor is 255, therefore the upper bound of q_decay is 8.
    // We do not need a clip here.
    q_decay = 0.5 * pow((double)q_factor / 64, 2);
  }
  // Smaller strength -> smaller filtering weight.
  double s_decay = pow((double)filter_strength / TF_STRENGTH_THRESHOLD, 2);
  s_decay = CLIP(s_decay, 1e-5, 1);
  double d_factor[4] = { 0 };
  uint16_t frame_sse[SSE_STRIDE * BH] = { 0 };
  uint32_t luma_sse_sum[BW * BH] = { 0 };

  for (int subblock_idx = 0; subblock_idx < 4; subblock_idx++) {
    // Larger motion vector -> smaller filtering weight.
    const MV mv = subblock_mvs[subblock_idx];
    const double distance = sqrt(pow(mv.row, 2) + pow(mv.col, 2));
    double distance_threshold = min_frame_size * TF_SEARCH_DISTANCE_THRESHOLD;
    distance_threshold = AOMMAX(distance_threshold, 1);
    d_factor[subblock_idx] = distance / distance_threshold;
    d_factor[subblock_idx] = AOMMAX(d_factor[subblock_idx], 1);
  }

  // Handle planes in sequence.
  int plane_offset = 0;
  for (int plane = 0; plane < num_planes; ++plane) {
    const uint32_t plane_h = mb_height >> mbd->plane[plane].subsampling_y;
    const uint32_t plane_w = mb_width >> mbd->plane[plane].subsampling_x;
    const uint32_t frame_stride = frame_to_filter->strides[plane == 0 ? 0 : 1];
    const int frame_offset = mb_row * plane_h * frame_stride + mb_col * plane_w;

    const uint8_t *ref = frame_to_filter->buffers[plane] + frame_offset;
    const int ss_x_shift =
        mbd->plane[plane].subsampling_x - mbd->plane[AOM_PLANE_Y].subsampling_x;
    const int ss_y_shift =
        mbd->plane[plane].subsampling_y - mbd->plane[AOM_PLANE_Y].subsampling_y;
    const int num_ref_pixels = TF_WINDOW_LENGTH * TF_WINDOW_LENGTH +
                               ((plane) ? (1 << (ss_x_shift + ss_y_shift)) : 0);
    const double inv_num_ref_pixels = 1.0 / num_ref_pixels;
    // Larger noise -> larger filtering weight.
    const double n_decay = 0.5 + log(2 * noise_levels[plane] + 5.0);
    // Decay factors for non-local mean approach.
    const double decay_factor = 1 / (n_decay * q_decay * s_decay);

    // Filter U-plane and V-plane using Y-plane. This is because motion
    // search is only done on Y-plane, so the information from Y-plane
    // will be more accurate. The luma sse sum is reused in both chroma
    // planes.
    if (plane == AOM_PLANE_U) {
      for (unsigned int i = 0, k = 0; i < plane_h; i++) {
        for (unsigned int j = 0; j < plane_w; j++, k++) {
          for (int ii = 0; ii < (1 << ss_y_shift); ++ii) {
            for (int jj = 0; jj < (1 << ss_x_shift); ++jj) {
              const int yy = (i << ss_y_shift) + ii;  // Y-coord on Y-plane.
              const int xx = (j << ss_x_shift) + jj;  // X-coord on Y-plane.
              luma_sse_sum[i * BW + j] += frame_sse[yy * SSE_STRIDE + xx + 2];
            }
          }
        }
      }
    }

    apply_temporal_filter(ref, frame_stride, pred + plane_offset, plane_w,
                          plane_w, plane_h, subblock_mses, accum + plane_offset,
                          count + plane_offset, frame_sse, luma_sse_sum,
                          inv_num_ref_pixels, decay_factor, inv_factor,
                          weight_factor, d_factor, tf_wgt_calc_lvl);
    plane_offset += plane_h * plane_w;
  }
}